

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::anon_unknown_0::ParseTime
          (anon_unknown_0 *this,string_view value,int64_t *seconds,int32_t *nanos)

{
  Time TVar1;
  ulong uVar2;
  bool bVar3;
  undefined1 auVar4 [12];
  timespec spec;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_3c [8];
  Time result;
  int32_t *nanos_local;
  int64_t *seconds_local;
  string_view value_local;
  
  result.rep_._4_8_ = seconds;
  absl::lts_20240722::Time::Time((Time *)local_3c);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,(char *)&absl::lts_20240722::RFC3339_full);
  uVar2 = absl::lts_20240722::ParseTime
                    (local_50._M_len,local_50._M_str,this,value._M_len,local_3c,0);
  bVar3 = (uVar2 & 1) != 0;
  if (bVar3) {
    TVar1.rep_.rep_lo_ = result.rep_.rep_hi_.lo_;
    TVar1.rep_.rep_hi_.lo_ = local_3c._0_4_;
    TVar1.rep_.rep_hi_.hi_ = local_3c._4_4_;
    auVar4 = absl::lts_20240722::ToTimespec(TVar1);
    *(long *)value._M_str = auVar4._0_8_;
    *(int *)result.rep_._4_8_ = auVar4._8_4_;
  }
  return bVar3;
}

Assistant:

bool ParseTime(absl::string_view value, int64_t* seconds, int32_t* nanos) {
  absl::Time result;
  if (!absl::ParseTime(absl::RFC3339_full, value, &result, nullptr)) {
    return false;
  }
  timespec spec = absl::ToTimespec(result);
  *seconds = spec.tv_sec;
  *nanos = spec.tv_nsec;
  return true;
}